

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

char * __thiscall QTreeModel::index(QTreeModel *this,char *__s,int __c)

{
  int iVar1;
  SortOrder SVar2;
  QTreeView *pQVar3;
  QHeaderView *pQVar4;
  undefined4 in_ECX;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined4 in_register_00000014;
  long lVar8;
  long lVar9;
  
  lVar8 = CONCAT44(in_register_00000014,__c);
  if (((__s[0x54] == '\0') && (*(int *)(__s + 0x50) != 0)) &&
     (*(long *)(*(long *)(__s + 8) + 0x88) == 0)) {
    QBasicTimer::stop();
    pQVar3 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar4 = QTreeView::header(pQVar3);
    iVar1 = QHeaderView::sortIndicatorSection(pQVar4);
    pQVar3 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar4 = QTreeView::header(pQVar3);
    SVar2 = QHeaderView::sortIndicatorOrder(pQVar4);
    (**(code **)(*(long *)__s + 0x140))(__s,iVar1,SVar2);
  }
  if ((lVar8 == 0) || (*(long *)(__s + 0x10) == lVar8)) {
    *(undefined8 *)this = 0xffffffffffffffff;
    *(undefined8 *)&this->field_0x8 = 0;
    this->rootItem = (QTreeWidgetItem *)0x0;
    return (char *)this;
  }
  lVar9 = *(long *)(__s + 0x10);
  if (*(long *)(lVar8 + 0x38) != 0) {
    lVar9 = *(long *)(lVar8 + 0x38);
  }
  iVar1 = *(int *)(*(long *)(lVar8 + 0x30) + 0x24);
  uVar5 = (ulong)iVar1;
  if (((-1 < (long)uVar5) && (uVar5 < *(ulong *)(lVar9 + 0x50))) &&
     (*(long *)(*(long *)(lVar9 + 0x48) + uVar5 * 8) == lVar8)) goto LAB_005b93d4;
  if (*(long *)(lVar9 + 0x50) < 1) {
LAB_005b93ca:
    iVar1 = -1;
  }
  else {
    lVar7 = *(long *)(lVar9 + 0x50) << 3;
    do {
      lVar6 = lVar7;
      lVar7 = lVar6;
      if (lVar6 == 0) goto LAB_005b93c5;
      lVar7 = lVar6 + -8;
    } while (*(long *)(*(long *)(lVar9 + 0x48) + -8 + lVar6) != lVar8);
    lVar7 = lVar6 + -8 >> 3;
LAB_005b93c5:
    iVar1 = (int)lVar7;
    if (lVar6 == 0) goto LAB_005b93ca;
  }
  *(int *)(*(long *)(lVar8 + 0x30) + 0x24) = iVar1;
LAB_005b93d4:
  *(int *)this = iVar1;
  *(undefined4 *)&this->field_0x4 = in_ECX;
  *(long *)&this->field_0x8 = lVar8;
  this->rootItem = (QTreeWidgetItem *)__s;
  return (char *)this;
}

Assistant:

QModelIndex QTreeModel::index(const QTreeWidgetItem *item, int column) const
{
    executePendingSort();

    if (!item || (item == rootItem))
        return QModelIndex();
    const QTreeWidgetItem *par = item->parent();
    QTreeWidgetItem *itm = const_cast<QTreeWidgetItem*>(item);
    if (!par)
        par = rootItem;
    int row;
    int guess = item->d->rowGuess;
    if (guess >= 0
        && par->children.size() > guess
        && par->children.at(guess) == itm) {
        row = guess;
    } else {
        row = par->children.lastIndexOf(itm);
        itm->d->rowGuess = row;
    }
    return createIndex(row, column, itm);
}